

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randname.c
# Opt level: O0

size_t randname_make(randname_type name_type,size_t min,size_t max,char *word_buf,size_t buflen,
                    char ***sections)

{
  char **learn;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  _Bool _Var4;
  long lVar5;
  int local_70;
  uint32_t local_6c;
  int c_next;
  int r;
  int iStack_60;
  _Bool contains_vowel;
  int tries;
  int c_cur;
  int c_prev;
  char *cp;
  char **wordlist;
  ulong uStack_40;
  _Bool found_word;
  size_t lnum;
  char ***sections_local;
  size_t buflen_local;
  char *word_buf_local;
  size_t max_local;
  size_t min_local;
  randname_type name_type_local;
  
  uStack_40 = 0;
  bVar1 = false;
  if ((name_type == 0) || (RANDNAME_SCROLL < name_type)) {
    __assert_fail("name_type > 0 && name_type < RANDNAME_NUM_TYPES",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/randname.c"
                  ,0x56,
                  "size_t randname_make(randname_type, size_t, size_t, char *, size_t, const char ***)"
                 );
  }
  if (buflen <= max) {
    __assert_fail("buflen > max",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/randname.c"
                  ,0x59,
                  "size_t randname_make(randname_type, size_t, size_t, char *, size_t, const char ***)"
                 );
  }
  if (randname_make::cached_type != name_type) {
    learn = sections[name_type];
    memset(randname_make::lprobs,0,0x9f78);
    build_prob(randname_make::lprobs,learn);
    randname_make::cached_type = name_type;
  }
  do {
    if (bVar1) {
      return uStack_40;
    }
    tries = 0x1a;
    iStack_60 = 0x1a;
    r = 0;
    bVar3 = false;
    uStack_40 = 0;
    _c_cur = word_buf;
    while( true ) {
      bVar2 = false;
      if ((r < 10) && (bVar2 = false, uStack_40 <= max)) {
        bVar2 = (bool)(bVar1 ^ 1);
      }
      if (!bVar2) break;
      local_70 = 0;
      if ((tries < 0) || (0x1a < tries)) {
        __assert_fail("c_prev >= 0 && c_prev <= S_WORD",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/randname.c"
                      ,0x7b,
                      "size_t randname_make(randname_type, size_t, size_t, char *, size_t, const char ***)"
                     );
      }
      if ((iStack_60 < 0) || (0x1a < iStack_60)) {
        __assert_fail("c_cur >= 0 && c_cur <= S_WORD",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/randname.c"
                      ,0x7c,
                      "size_t randname_make(randname_type, size_t, size_t, char *, size_t, const char ***)"
                     );
      }
      for (local_6c = Rand_div((uint)randname_make::lprobs[tries][iStack_60][0x1b]);
          (int)(uint)randname_make::lprobs[tries][iStack_60][local_70] <= (int)local_6c;
          local_6c = local_6c - randname_make::lprobs[tries][iStack_60][lVar5]) {
        lVar5 = (long)local_70;
        local_70 = local_70 + 1;
      }
      if (0x1a < local_70) {
        __assert_fail("c_next <= E_WORD",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/randname.c"
                      ,0x85,
                      "size_t randname_make(randname_type, size_t, size_t, char *, size_t, const char ***)"
                     );
      }
      if (local_70 < 0) {
        __assert_fail("c_next >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/randname.c"
                      ,0x86,
                      "size_t randname_make(randname_type, size_t, size_t, char *, size_t, const char ***)"
                     );
      }
      if (local_70 == 0x1a) {
        if ((uStack_40 < min) || (!bVar3)) {
          r = r + 1;
        }
        else {
          *_c_cur = '\0';
          bVar1 = true;
        }
      }
      else {
        *_c_cur = (char)local_70 + 'a';
        _Var4 = is_a_vowel((int)*_c_cur);
        if (_Var4) {
          bVar3 = true;
        }
        _c_cur = _c_cur + 1;
        uStack_40 = uStack_40 + 1;
        if (0x1a < local_70) {
          __assert_fail("c_next <= S_WORD",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/randname.c"
                        ,0x9c,
                        "size_t randname_make(randname_type, size_t, size_t, char *, size_t, const char ***)"
                       );
        }
        if (local_70 < 0) {
          __assert_fail("c_next >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/randname.c"
                        ,0x9d,
                        "size_t randname_make(randname_type, size_t, size_t, char *, size_t, const char ***)"
                       );
        }
        tries = iStack_60;
        iStack_60 = local_70;
      }
    }
  } while( true );
}

Assistant:

size_t randname_make(randname_type name_type, size_t min, size_t max,
					 char *word_buf, size_t buflen, const char ***sections)
{
	size_t lnum = 0;
	bool found_word = false;

	static name_probs lprobs;
	static randname_type cached_type = RANDNAME_NUM_TYPES;

	assert(name_type > 0 && name_type < RANDNAME_NUM_TYPES);

	/* To allow for a terminating character */
	assert(buflen > max);

	/* We cache one set of probabilities, only regenerate when
	   the type changes.  It's as good a way as any for now.
	   Frankly, we could probably regenerate every time. */
	if (cached_type != name_type) {
		const char **wordlist = NULL;

		wordlist = sections[name_type];

		(void)memset(lprobs, 0, sizeof(name_probs));
		build_prob(lprobs, wordlist);

		cached_type = name_type;
	}
        
	/* Generate the actual word wanted. */
	while (!found_word) {
		char *cp = word_buf;
		int c_prev = S_WORD;
		int c_cur = S_WORD;
		int tries = 0;
		bool contains_vowel = false;
		lnum = 0;

		/* We start the word again if we run out of space or have
		   had to have 10 goes to find a word that satisfies the
		   minimal conditions. */
		while (tries < 10 && lnum <= max && !found_word) {
			/* Pick the next letter based on a simple weighting
			  of which letters can follow the previous two */
			int r;
			int c_next = 0;

			assert(c_prev >= 0 && c_prev <= S_WORD);
			assert(c_cur >= 0 && c_cur <= S_WORD);

			r = randint0(lprobs[c_prev][c_cur][TOTAL]);

			while (r >= lprobs[c_prev][c_cur][c_next]) {
				r -= lprobs[c_prev][c_cur][c_next];
				c_next++;
			}

			assert(c_next <= E_WORD);
			assert(c_next >= 0);
            
			if (c_next == E_WORD) {
				/* If we've reached the end, we check if we've
				   met the simple conditions, otherwise have
				   another go at choosing a letter for this
				   position. */
				if (lnum >= min && contains_vowel) {
					*cp = '\0';
					found_word = true;
				} else {
					tries++;
				}
			} else {
				/* Add the letter to the word and move on. */
				*cp = I2A(c_next);

				if (is_a_vowel(*cp))
					contains_vowel = true;

				cp++;
				lnum++;
				assert(c_next <= S_WORD);
				assert(c_next >= 0);
				c_prev = c_cur;
				c_cur = c_next;
			}
		}
	}

	return lnum;
}